

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void init_extension_bitmap(st_ptls_extension_bitmap_t *bitmap,uint8_t hstype)

{
  int *local_50;
  int _found_10;
  int _found_9;
  int _found_8;
  int _found_7;
  int _found_6;
  int _found_5;
  int _found_4;
  int _found_3;
  int _found_2;
  int _found_1;
  int _found;
  uint8_t local_11;
  st_ptls_extension_bitmap_t *psStack_10;
  uint8_t hstype_local;
  st_ptls_extension_bitmap_t *bitmap_local;
  
  local_50 = &_found;
  local_11 = hstype;
  psStack_10 = bitmap;
  do {
    *(undefined1 *)local_50 = 0;
    local_50 = (int *)((long)local_50 + 1);
  } while (local_50 != (int *)&local_11);
  *(ulong *)bitmap->bits = (ulong)__found << 8;
  if (local_11 != '\x01' && local_11 != '\b') {
    extension_bitmap_set(psStack_10,0);
  }
  if ((local_11 != '\x01' && local_11 != '\v') && local_11 != '\r') {
    extension_bitmap_set(psStack_10,5);
  }
  if (local_11 != '\x01' && local_11 != '\b') {
    extension_bitmap_set(psStack_10,10);
  }
  if (local_11 != '\x01' && local_11 != '\r') {
    extension_bitmap_set(psStack_10,0xd);
  }
  if (local_11 != '\x01' && local_11 != '\b') {
    extension_bitmap_set(psStack_10,0x10);
  }
  if (local_11 != '\x01' && local_11 != '\x02') {
    extension_bitmap_set(psStack_10,0x33);
  }
  if (local_11 != '\x01' && local_11 != '\x02') {
    extension_bitmap_set(psStack_10,0x29);
  }
  if (local_11 != '\x01') {
    extension_bitmap_set(psStack_10,0x2d);
  }
  if ((local_11 != '\x01' && local_11 != '\b') && local_11 != '\x04') {
    extension_bitmap_set(psStack_10,0x2a);
  }
  if (local_11 != '\x01' && local_11 != '\x02') {
    extension_bitmap_set(psStack_10,0x2c);
  }
  if (local_11 != '\x01' && local_11 != '\x02') {
    extension_bitmap_set(psStack_10,0x2b);
  }
  return;
}

Assistant:

static inline void init_extension_bitmap(struct st_ptls_extension_bitmap_t *bitmap, uint8_t hstype)
{
    *bitmap = (struct st_ptls_extension_bitmap_t){{0}};

#define EXT(extid, proc)                                                                                                           \
    do {                                                                                                                           \
        int _found = 0;                                                                                                            \
        do {                                                                                                                       \
            proc                                                                                                                   \
        } while (0);                                                                                                               \
        if (!_found)                                                                                                               \
            extension_bitmap_set(bitmap, PTLS_EXTENSION_TYPE_##extid);                                                             \
    } while (0)
#define ALLOW(allowed_hstype) _found = _found || hstype == PTLS_HANDSHAKE_TYPE_##allowed_hstype

    /* Implements the table found in section 4.2 of draft-19; "If an implementation receives an extension which it recognizes and
     * which is not specified for the message in which it appears it MUST abort the handshake with an “illegal_parameter” alert."
     */
    EXT(SERVER_NAME, {
        ALLOW(CLIENT_HELLO);
        ALLOW(ENCRYPTED_EXTENSIONS);
    });
    EXT(STATUS_REQUEST, {
        ALLOW(CLIENT_HELLO);
        ALLOW(CERTIFICATE);
        ALLOW(CERTIFICATE_REQUEST);
    });
    EXT(SUPPORTED_GROUPS, {
        ALLOW(CLIENT_HELLO);
        ALLOW(ENCRYPTED_EXTENSIONS);
    });
    EXT(SIGNATURE_ALGORITHMS, {
        ALLOW(CLIENT_HELLO);
        ALLOW(CERTIFICATE_REQUEST);
    });
    EXT(ALPN, {
        ALLOW(CLIENT_HELLO);
        ALLOW(ENCRYPTED_EXTENSIONS);
    });
    EXT(KEY_SHARE, {
        ALLOW(CLIENT_HELLO);
        ALLOW(SERVER_HELLO);
    });
    EXT(PRE_SHARED_KEY, {
        ALLOW(CLIENT_HELLO);
        ALLOW(SERVER_HELLO);
    });
    EXT(PSK_KEY_EXCHANGE_MODES, { ALLOW(CLIENT_HELLO); });
    EXT(EARLY_DATA, {
        ALLOW(CLIENT_HELLO);
        ALLOW(ENCRYPTED_EXTENSIONS);
        ALLOW(NEW_SESSION_TICKET);
    });
    EXT(COOKIE, {
        ALLOW(CLIENT_HELLO);
        ALLOW(SERVER_HELLO);
    });
    EXT(SUPPORTED_VERSIONS, {
        ALLOW(CLIENT_HELLO);
        ALLOW(SERVER_HELLO);
    });

#undef ALLOW
#undef EXT
}